

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  undefined1 uVar1;
  byte bVar2;
  ostream *poVar3;
  IStreamingReporter *pIVar4;
  undefined8 *in_RDX;
  string *in_RSI;
  long in_RDI;
  ostringstream oss;
  SourceLineInfo *in_stack_fffffffffffffdf8;
  undefined6 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe06;
  undefined1 in_stack_fffffffffffffe07;
  RunningTest *this_00;
  string local_1c8 [48];
  ostringstream local_198 [376];
  undefined8 *local_20;
  string *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,local_18);
  std::operator<<(poVar3,"@");
  operator<<((ostream *)
             CONCAT17(in_stack_fffffffffffffe07,
                      CONCAT16(in_stack_fffffffffffffe06,in_stack_fffffffffffffe00)),
             in_stack_fffffffffffffdf8);
  this_00 = *(RunningTest **)(in_RDI + 0x38);
  std::__cxx11::ostringstream::str();
  uVar1 = RunningTest::addSection
                    (this_00,(string *)
                             CONCAT17(in_stack_fffffffffffffe07,
                                      CONCAT16(in_stack_fffffffffffffe06,in_stack_fffffffffffffe00))
                    );
  bVar2 = uVar1 ^ 0xff;
  std::__cxx11::string::~string(local_1c8);
  local_1 = (bVar2 & 1) == 0;
  if ((bool)local_1) {
    SourceLineInfo::operator=
              ((SourceLineInfo *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe00)),
               in_stack_fffffffffffffdf8);
    pIVar4 = Ptr<Catch::IStreamingReporter>::operator->
                       ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x120));
    (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar4,local_18);
    *local_20 = *(undefined8 *)(in_RDI + 0x100);
    local_20[1] = *(undefined8 *)(in_RDI + 0x108);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool sectionStarted (
            SectionInfo const& sectionInfo,
            Counts& assertions
        )
        {
            std::ostringstream oss;
            oss << sectionInfo.name << "@" << sectionInfo.lineInfo;

            if( !m_runningTest->addSection( oss.str() ) )
                return false;

            m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

            m_reporter->sectionStarting( sectionInfo );

            assertions = m_totals.assertions;

            return true;
        }